

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

_Bool realloc_tensor(TENSOR *tensor,int channels,int width,int height)

{
  int iVar1;
  void *pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int c;
  int newallocsize;
  int local_24;
  
  iVar1 = in_ESI * in_EDX * in_ECX;
  if (*in_RDI < iVar1) {
    free_tensor((TENSOR *)0x6eda8e);
    pvVar2 = aom_malloc(0x6eda9c);
    *(void **)(in_RDI + 6) = pvVar2;
    if (*(long *)(in_RDI + 6) == 0) {
      return false;
    }
    *in_RDI = iVar1;
  }
  in_RDI[2] = in_EDX;
  in_RDI[3] = in_ECX;
  in_RDI[4] = in_EDX;
  in_RDI[1] = in_ESI;
  for (local_24 = 1; local_24 < in_ESI; local_24 = local_24 + 1) {
    *(long *)(in_RDI + (long)local_24 * 2 + 6) =
         *(long *)(in_RDI + 6) + (long)(local_24 * in_EDX * in_ECX) * 4;
  }
  return true;
}

Assistant:

static bool realloc_tensor(TENSOR *tensor, int channels, int width,
                           int height) {
  const int newallocsize = channels * width * height;
  if (tensor->allocsize < newallocsize) {
    free_tensor(tensor);
    tensor->buf[0] =
        (float *)aom_malloc(sizeof(*tensor->buf[0]) * newallocsize);
    if (!tensor->buf[0]) return false;
    tensor->allocsize = newallocsize;
  }
  tensor->width = width;
  tensor->height = height;
  tensor->stride = width;
  tensor->channels = channels;
  for (int c = 1; c < channels; ++c)
    tensor->buf[c] = &tensor->buf[0][c * width * height];
  return true;
}